

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointTrifaceRot::ConstraintsLoadJacobians(ChLinkPointTrifaceRot *this)

{
  ChRowVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1> *pCVar1;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<6,_6,_6>::nvars1> *pCVar2;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<6,_6,_6>::nvars2> *pCVar3;
  ChRowVectorN<double,_ChVariableTupleCarrier_3vars<6,_6,_6>::nvars3> *pCVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ulong in_XMM11_Qa;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ChMatrix33<double> Jxb2;
  ChMatrix33<double> Jxb1;
  ChMatrix33<double> Jxa;
  double local_208;
  double dStack_200;
  undefined8 uStack_1f8;
  double dStack_1f0;
  double dStack_1e8;
  double dStack_1e0;
  undefined8 uStack_1d8;
  double dStack_1d0;
  double local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 local_128;
  ulong local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  double local_28;
  undefined8 uStack_20;
  undefined1 extraout_var [56];
  
  auVar27._0_8_ = (1.0 - this->s2) - this->s3;
  local_d0 = 0x3ff0000000000000;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_b0 = 0x3ff0000000000000;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  local_90 = 0x3ff0000000000000;
  if ((this->d != 0.0) || (NAN(this->d))) {
    uStack_20 = 0;
    peVar5 = (this->mtriangle).mnodeB1.
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar6 = (this->mtriangle).mnodeB2.
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e0 = *(double *)&(peVar5->super_ChNodeFEAbase).field_0x20;
    local_f0 = local_e0 - *(double *)&(peVar6->super_ChNodeFEAbase).field_0x20;
    peVar7 = (this->mtriangle).mnodeB3.
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f8 = *(double *)&peVar5->field_0x28 - *(double *)&peVar7->field_0x28;
    local_d8 = *(double *)&peVar5->field_0x28 - *(double *)&peVar6->field_0x28;
    local_e0 = local_e0 - *(double *)&(peVar7->super_ChNodeFEAbase).field_0x20;
    dVar12 = local_f8 * local_f0 - local_d8 * local_e0;
    local_e8 = *(double *)&peVar5->field_0x30 - *(double *)&peVar7->field_0x30;
    local_100 = *(double *)&peVar5->field_0x30 - *(double *)&peVar6->field_0x30;
    dVar57 = local_f0 * local_e8 - local_100 * local_e0;
    auVar24._8_8_ = 0x7fffffffffffffff;
    auVar24._0_8_ = 0x7fffffffffffffff;
    local_38._8_8_ = 0;
    local_38._0_8_ = dVar12;
    local_88 = vandpd_avx(local_38,auVar24);
    local_48._8_8_ = 0;
    local_48._0_8_ = dVar57;
    local_68 = vandpd_avx(local_48,auVar24);
    dVar13 = local_d8 * local_e8 - local_f8 * local_100;
    local_58._8_8_ = 0;
    local_58._0_8_ = dVar13;
    local_78 = vandpd_avx(local_58,auVar24);
    local_110 = *(double *)&peVar6->field_0x30 - *(double *)&peVar7->field_0x30;
    dVar57 = dVar13 * dVar13 + dVar12 * dVar12 + dVar57 * dVar57;
    local_108 = (double)(int)((uint)(0.0 < dVar12) - (uint)(dVar12 < 0.0));
    local_28 = auVar27._0_8_;
    auVar35._0_8_ = pow(dVar57,1.5);
    auVar35._8_56_ = extraout_var;
    auVar21 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar35._0_16_);
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         *(ulong *)&((this->mtriangle).mnodeB2.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->field_0x28;
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         *(ulong *)&((this->mtriangle).mnodeB3.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->field_0x28;
    auVar22 = vsubsd_avx512f(auVar25,auVar23);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar57;
    if (dVar57 < 0.0) {
      vmovsd_avx512f(auVar21);
      vmovsd_avx512f(auVar22);
      auVar27._0_8_ = sqrt(dVar57);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_118;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar57;
    }
    else {
      auVar27 = vsqrtsd_avx(auVar26,auVar26);
    }
    auVar32 = vucomisd_avx512f(ZEXT816(0) << 0x40);
    auVar30 = vucomisd_avx512f(auVar32);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = in_XMM11_Qa;
    auVar34._0_8_ = 1.0 / auVar27._0_8_;
    auVar34._8_8_ = 0;
    dVar14 = *(double *)
              &(((this->mtriangle).mnodeB2.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->super_ChNodeFEAbase).field_0x20 -
             *(double *)
              &(((this->mtriangle).mnodeB3.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->super_ChNodeFEAbase).field_0x20;
    auVar30 = vucomisd_avx512f(auVar30);
    vucomisd_avx512f(auVar30);
    auVar27._0_8_ = this->d;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = auVar27._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_110;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_110 * auVar27._0_8_;
    auVar23 = vmulsd_avx512f(auVar34,auVar29);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_108;
    auVar24 = vmulsd_avx512f(local_88,auVar68);
    auVar25 = vmulsd_avx512f(auVar24,auVar22);
    auVar26 = vmulsd_avx512f(auVar44,local_68);
    dVar57 = auVar26._0_8_ * 0.0;
    dVar57 = auVar25._0_8_ + auVar25._0_8_ + dVar57 + dVar57;
    dVar12 = auVar24._0_8_ * dVar14;
    auVar24 = vmulsd_avx512f(auVar44,local_78);
    dVar13 = auVar24._0_8_ * 0.0;
    dVar15 = (dVar12 + dVar12) - (dVar13 + dVar13);
    auVar24 = vmulsd_avx512f(local_68,auVar28 << 0x40);
    dVar12 = auVar24._0_8_ * dVar14;
    auVar24 = vmulsd_avx512f(local_78,auVar22);
    dVar13 = auVar24._0_8_ * 0.0;
    dVar12 = dVar13 + dVar13 + dVar12 + dVar12;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_f8;
    auVar24 = vmulsd_avx512f(auVar66,local_88);
    auVar24 = vmulsd_avx512f(auVar24,auVar68);
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_e8;
    auVar25 = vmulsd_avx512f(auVar74,local_68);
    dVar13 = auVar25._0_8_ * 0.0;
    dVar13 = auVar24._0_8_ + auVar24._0_8_ + dVar13 + dVar13;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_e0;
    auVar24 = vmulsd_avx512f(auVar72,local_88);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_108;
    auVar24 = vmulsd_avx512f(auVar24,auVar69);
    auVar25 = vmulsd_avx512f(auVar74,local_78);
    dVar8 = auVar25._0_8_ * 0.0;
    dVar16 = (auVar24._0_8_ + auVar24._0_8_) - (dVar8 + dVar8);
    auVar24 = vmulsd_avx512f(auVar72,local_68);
    dVar8 = auVar24._0_8_ * 0.0;
    auVar24 = vmulsd_avx512f(auVar66,local_78);
    dVar9 = auVar24._0_8_ * 0.0;
    dVar8 = dVar8 + dVar8 + dVar9 + dVar9;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_100;
    dStack_1f0 = auVar34._0_8_ * local_100 * auVar27._0_8_;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_d8;
    auVar24 = vmulsd_avx512f(auVar70,local_88);
    auVar24 = vmulsd_avx512f(auVar24,auVar69);
    auVar25 = vmulsd_avx512f(auVar45,local_68);
    dVar9 = auVar25._0_8_ * 0.0;
    dVar9 = auVar24._0_8_ + auVar24._0_8_ + dVar9 + dVar9;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_f0;
    auVar24 = vmulsd_avx512f(auVar65,local_88);
    auVar24 = vmulsd_avx512f(auVar24,auVar69);
    auVar25 = vmulsd_avx512f(auVar45,local_78);
    dVar10 = auVar25._0_8_ * 0.0;
    dVar17 = (auVar24._0_8_ + auVar24._0_8_) - (dVar10 + dVar10);
    auVar24 = vmulsd_avx512f(auVar65,local_68);
    dVar10 = auVar24._0_8_ * 0.0;
    auVar24 = vmulsd_avx512f(auVar70,local_78);
    dVar11 = auVar24._0_8_ * 0.0;
    dVar10 = dVar10 + dVar10 + dVar11 + dVar11;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar14;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auVar34._0_8_ * auVar27._0_8_;
    auVar24 = vmulsd_avx512f(auVar41,auVar43);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_f8;
    auVar25 = vmulsd_avx512f(auVar67,auVar36);
    auVar25 = vmulsd_avx512f(auVar34,auVar25);
    dStack_1d0 = auVar34._0_8_ * local_f0 * auVar27._0_8_;
    auVar42._8_8_ = 0x8000000000000000;
    auVar42._0_8_ = 0x8000000000000000;
    auVar33._8_8_ = uStack_20;
    auVar33._0_8_ = local_28;
    auVar27 = vxorpd_avx512vl(auVar33,auVar42);
    auVar26 = vmulsd_avx512f(auVar30,auVar36);
    auVar26 = vmulsd_avx512f(auVar21,auVar26);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar57;
    auVar28 = vmulsd_avx512f(auVar58,auVar26);
    auVar37 = ZEXT816(0x3fe0000000000000);
    auVar28 = vmulsd_avx512f(auVar28,auVar37);
    auVar28 = vsubsd_avx512f(auVar28,auVar33);
    vmovsd_avx512f(auVar28);
    auVar28 = vxorpd_avx512vl(auVar23,auVar42);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar15;
    auVar29 = vmulsd_avx512f(auVar26,auVar54);
    auVar29 = vmulsd_avx512f(auVar29,auVar37);
    auVar28 = vsubsd_avx512f(auVar28,auVar29);
    vmovsd_avx512f(auVar28);
    auVar28 = vxorpd_avx512vl(auVar36,auVar42);
    auVar30 = vmulsd_avx512f(auVar30,auVar28);
    auVar30 = vmulsd_avx512f(auVar21,auVar30);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar12;
    auVar29 = vmulsd_avx512f(auVar30,auVar61);
    auVar29 = vmulsd_avx512f(auVar29,auVar37);
    auVar22 = vmulsd_avx512f(auVar22,auVar36);
    auVar29 = vfmadd231sd_avx512f(auVar29,auVar22,auVar34);
    vmovsd_avx512f(auVar29);
    auVar29 = vmulsd_avx512f(auVar32,auVar28);
    auVar29 = vmulsd_avx512f(auVar21,auVar29);
    auVar31 = vmulsd_avx512f(auVar58,auVar29);
    auVar31 = vmulsd_avx512f(auVar31,auVar37);
    auVar23 = vaddsd_avx512f(auVar23,auVar31);
    vmovsd_avx512f(auVar23);
    auVar32 = vmulsd_avx512f(auVar32,auVar36);
    auVar23 = vmulsd_avx512f(auVar21,auVar32);
    auVar32 = vmulsd_avx512f(auVar23,auVar54);
    auVar32 = vmulsd_avx512f(auVar32,auVar37);
    auVar32 = vsubsd_avx512f(auVar32,auVar33);
    vmovsd_avx512f(auVar32);
    auVar32 = vmulsd_avx512f(auVar23,auVar61);
    auVar32 = vmulsd_avx512f(auVar32,auVar37);
    auVar32 = vsubsd_avx512f(auVar32,auVar24);
    vmovsd_avx512f(auVar32);
    auVar32 = vmulsd_avx512f(local_38,auVar36);
    auVar33 = vmulsd_avx512f(auVar21,auVar32);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar57;
    auVar32 = vmulsd_avx512f(auVar59,auVar33);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = auVar32._0_8_ * 0.5;
    auVar32 = vfnmadd231sd_avx512f(auVar60,auVar34,auVar22);
    uStack_138 = auVar32._0_8_;
    auVar32 = vmulsd_avx512f(local_38,auVar28);
    auVar32 = vmulsd_avx512f(auVar21,auVar32);
    dVar57 = auVar32._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar57 * dVar15 * 0.5;
    auVar32 = vaddsd_avx512f(auVar24,auVar55);
    uStack_130 = auVar32._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar12;
    auVar32 = vmulsd_avx512f(auVar33,auVar62);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = auVar32._0_8_ * 0.5;
    auVar27 = vsubsd_avx512f(auVar27,auVar56);
    local_128 = auVar27._0_8_;
    auVar63._0_8_ = -this->s2;
    auVar63._8_8_ = 0x8000000000000000;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar13;
    auVar27 = vmulsd_avx512f(auVar46,auVar26);
    auVar27 = vmulsd_avx512f(auVar27,auVar37);
    auVar27 = vsubsd_avx512f(auVar63,auVar27);
    vmovsd_avx512f(auVar27);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_e8;
    auVar27 = vmulsd_avx512f(auVar75,auVar36);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar16;
    auVar32 = vmulsd_avx512f(auVar49,auVar26);
    auVar32 = vmulsd_avx512f(auVar32,auVar37);
    auVar32 = vfmadd231sd_avx512f(auVar32,auVar27,auVar34);
    vmovsd_avx512f(auVar32);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar8;
    auVar32 = vmulsd_avx512f(auVar52,auVar26);
    auVar32 = vmulsd_avx512f(auVar32,auVar37);
    auVar32 = vsubsd_avx512f(auVar32,auVar25);
    vmovsd_avx512f(auVar32);
    auVar32 = vmulsd_avx512f(auVar46,auVar23);
    auVar32 = vmulsd_avx512f(auVar32,auVar37);
    auVar27 = vfnmadd231sd_avx512f(auVar32,auVar34,auVar27);
    vmovsd_avx512f(auVar27);
    auVar27 = vmulsd_avx512f(auVar49,auVar23);
    auVar27 = vmulsd_avx512f(auVar27,auVar37);
    auVar27 = vsubsd_avx512f(auVar63,auVar27);
    uStack_198 = auVar27._0_8_;
    auVar27 = vmulsd_avx512f(auVar52,auVar29);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_e0;
    auVar32 = vmulsd_avx512f(auVar73,auVar36);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = auVar27._0_8_ * 0.5;
    auVar27 = vfmadd231sd_avx512f(auVar64,auVar32,auVar34);
    uStack_190 = auVar27._0_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar13 * dVar57 * 0.5;
    auVar27 = vaddsd_avx512f(auVar25,auVar47);
    uStack_188 = auVar27._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar16;
    auVar27 = vmulsd_avx512f(auVar50,auVar33);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = auVar27._0_8_ * 0.5;
    auVar27 = vfnmadd231sd_avx512f(auVar48,auVar34,auVar32);
    uStack_180 = auVar27._0_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar8;
    auVar27 = vmulsd_avx512f(auVar53,auVar33);
    local_178 = auVar27._0_8_ * 0.5 - this->s2;
    auVar27._0_8_ = this->s3;
    local_208 = auVar26._0_8_ * dVar9 * 0.5 - auVar27._0_8_;
    dStack_200 = -dStack_1f0 - auVar26._0_8_ * dVar17 * 0.5;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar10;
    auVar32 = vmulsd_avx512f(auVar39,auVar30);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_d8;
    auVar30 = vmulsd_avx512f(auVar71,auVar36);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auVar32._0_8_ * 0.5;
    auVar32 = vfmadd231sd_fma(auVar51,auVar30,auVar34);
    uStack_1f8 = auVar32._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar9;
    auVar32 = vmulsd_avx512f(auVar31,auVar29);
    dStack_1f0 = auVar32._0_8_ * 0.5 + dStack_1f0;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar17;
    auVar32 = vmulsd_avx512f(auVar38,auVar23);
    dStack_1e8 = auVar32._0_8_ * 0.5 - auVar27._0_8_;
    auVar32 = vmulsd_avx512f(auVar39,auVar23);
    dStack_1e0 = auVar32._0_8_ * 0.5 - dStack_1d0;
    auVar32 = vmulsd_avx512f(auVar31,auVar33);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = auVar32._0_8_ * 0.5;
    auVar32 = vfnmadd231sd_fma(auVar37,auVar30,auVar34);
    uStack_1d8 = auVar32._0_8_;
    dStack_1d0 = dStack_1d0 + dVar57 * dVar17 * 0.5;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar10;
    auVar32 = vmulsd_avx512f(auVar40,auVar33);
    auVar27._0_8_ = -auVar27._0_8_ - auVar32._0_8_ * 0.5;
  }
  else {
    uStack_160 = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    uStack_140 = 0;
    uStack_138 = 0;
    uStack_130 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    uStack_190 = 0;
    uStack_188 = 0;
    uStack_180 = 0;
    dStack_200 = 0.0;
    uStack_1f8 = 0;
    dStack_1f0 = 0.0;
    dStack_1e0 = 0.0;
    uStack_1d8 = 0;
    dStack_1d0 = 0.0;
    auVar30._0_8_ = -auVar27._0_8_;
    auVar30._8_8_ = 0x8000000000000000;
    local_168 = vmovlpd_avx(auVar30);
    uStack_148 = vmovlpd_avx(auVar30);
    local_128 = vmovlpd_avx(auVar30);
    auVar32._0_8_ = -this->s2;
    auVar32._8_8_ = 0x8000000000000000;
    local_1b8 = vmovlpd_avx(auVar32);
    uStack_198 = vmovlpd_avx(auVar32);
    local_178 = (double)vmovlpd_avx(auVar32);
    auVar27._0_8_ = -this->s3;
    auVar27._8_8_ = 0x8000000000000000;
    local_208 = (double)vmovlpd_avx(auVar27);
    dStack_1e8 = (double)vmovlpd_avx(auVar27);
  }
  pCVar1 = &(this->constraint1).tuple_a.Cq;
  uVar18 = -((uint)((ulong)pCVar1 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  local_1c8 = auVar27._0_8_;
  if (uVar18 != 0) {
    memcpy(pCVar1,&local_d0,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint1).tuple_a.Cq.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&local_d0 + uVar20),0x18 - uVar20);
  }
  pCVar1 = &(this->constraint2).tuple_a.Cq;
  uVar18 = -((uint)((ulong)pCVar1 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar1,&local_b8,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint2).tuple_a.Cq.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&local_b8 + uVar20),0x18 - uVar20);
  }
  pCVar1 = &(this->constraint3).tuple_a.Cq;
  uVar18 = -((uint)((ulong)pCVar1 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar1,&uStack_a0,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint3).tuple_a.Cq.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&uStack_a0 + uVar20),0x18 - uVar20);
  }
  pCVar2 = &(this->constraint1).tuple_b.Cq_1;
  uVar18 = -((uint)((ulong)pCVar2 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar2,&local_168,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint1).tuple_b.Cq_1.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&local_168 + uVar20),0x18 - uVar20);
  }
  pCVar2 = &(this->constraint2).tuple_b.Cq_1;
  uVar18 = -((uint)((ulong)pCVar2 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar2,&uStack_150,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint2).tuple_b.Cq_1.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&uStack_150 + uVar20),0x18 - uVar20)
    ;
  }
  pCVar2 = &(this->constraint3).tuple_b.Cq_1;
  uVar18 = -((uint)((ulong)pCVar2 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar2,&uStack_138,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint3).tuple_b.Cq_1.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&uStack_138 + uVar20),0x18 - uVar20)
    ;
  }
  pCVar3 = &(this->constraint1).tuple_b.Cq_2;
  uVar18 = -((uint)((ulong)pCVar3 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar3,&local_1b8,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint1).tuple_b.Cq_2.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&local_1b8 + uVar20),0x18 - uVar20);
  }
  pCVar3 = &(this->constraint2).tuple_b.Cq_2;
  uVar18 = -((uint)((ulong)pCVar3 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar3,&uStack_1a0,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint2).tuple_b.Cq_2.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&uStack_1a0 + uVar20),0x18 - uVar20)
    ;
  }
  pCVar3 = &(this->constraint3).tuple_b.Cq_2;
  uVar18 = -((uint)((ulong)pCVar3 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar3,&uStack_188,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint3).tuple_b.Cq_2.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&uStack_188 + uVar20),0x18 - uVar20)
    ;
  }
  pCVar4 = &(this->constraint1).tuple_b.Cq_3;
  uVar18 = -((uint)((ulong)pCVar4 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar4,&local_208,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint1).tuple_b.Cq_3.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&local_208 + uVar20),0x18 - uVar20);
  }
  pCVar4 = &(this->constraint2).tuple_b.Cq_3;
  uVar18 = -((uint)((ulong)pCVar4 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar4,&dStack_1f0,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint2).tuple_b.Cq_3.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&dStack_1f0 + uVar20),0x18 - uVar20)
    ;
  }
  pCVar4 = &(this->constraint3).tuple_b.Cq_3;
  uVar18 = -((uint)((ulong)pCVar4 >> 3) & 0x1fffffff) & 6;
  uVar19 = 3;
  if (uVar18 < 3) {
    uVar19 = uVar18;
  }
  if (uVar18 != 0) {
    memcpy(pCVar4,&uStack_1d8,(ulong)(uVar19 * 8));
  }
  if (uVar19 != 3) {
    uVar20 = (ulong)(uVar19 << 3);
    memcpy((void *)((long)(this->constraint3).tuple_b.Cq_3.
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
                          m_data.array + uVar20),(void *)((long)&uStack_1d8 + uVar20),0x18 - uVar20)
    ;
  }
  return;
}

Assistant:

void ChLinkPointTrifaceRot::ConstraintsLoadJacobians() {
    double s1 = 1 - s2 - s3;

    // compute jacobians
    ChMatrix33<> Jxa;
    Jxa.setIdentity();

    ChMatrix33<> Jxb1;
    ChMatrix33<> Jxb2;
    ChMatrix33<> Jxb3;

    if (d != 0) {
        double t2 = mtriangle.mnodeB1->coord.pos.x() - mtriangle.mnodeB2->coord.pos.x();
        double t3 = mtriangle.mnodeB1->coord.pos.y() - mtriangle.mnodeB3->coord.pos.y();
        double t4 = t2 * t3;
        double t5 = mtriangle.mnodeB1->coord.pos.y() - mtriangle.mnodeB2->coord.pos.y();
        double t6 = mtriangle.mnodeB1->coord.pos.x() - mtriangle.mnodeB3->coord.pos.x();
        double t12 = t5 * t6;
        double t7 = t4 - t12;
        double t8 = mtriangle.mnodeB1->coord.pos.z() - mtriangle.mnodeB3->coord.pos.z();
        double t9 = t2 * t8;
        double t10 = mtriangle.mnodeB1->coord.pos.z() - mtriangle.mnodeB2->coord.pos.z();
        double t14 = t6 * t10;
        double t11 = t9 - t14;
        double t13 = std::abs(t7);
        double t15 = std::abs(t11);
        double t16 = t5 * t8;
        double t22 = t3 * t10;
        double t17 = t16 - t22;
        double t18 = std::abs(t17);
        double t19 = mtriangle.mnodeB2->coord.pos.z() - mtriangle.mnodeB3->coord.pos.z();
        double t20 = std::pow(t13, 2);
        double t21 = std::pow(t15, 2);
        double t23 = std::pow(t18, 2);
        double t24 = t20 + t21 + t23;
        double t25 = mysgn(t7);
        double t26 = 1.0 / std::pow(t24, (3.0 / 2.0));
        double t27 = mtriangle.mnodeB2->coord.pos.y() - mtriangle.mnodeB3->coord.pos.y();
        double t28 = 1.0 / sqrt(t24);
        double t29 = mysgn(t11);
        double t30 = mtriangle.mnodeB2->coord.pos.x() - mtriangle.mnodeB3->coord.pos.x();
        double t31 = mysgn(t17);
        double t32 = d * t19 * t28;
        double t33 = t13 * t25 * t27 * 2.0;
        double t34 = t15 * t19 * t29 * 2.0;
        double t35 = t33 + t34;
        double t36 = t13 * t25 * t30 * 2.0;
        double t59 = t18 * t19 * t31 * 2.0;
        double t37 = t36 - t59;
        double t38 = t15 * t29 * t30 * 2.0;
        double t39 = t18 * t27 * t31 * 2.0;
        double t40 = t38 + t39;
        double t41 = t3 * t13 * t25 * 2.0;
        double t42 = t8 * t15 * t29 * 2.0;
        double t43 = t41 + t42;
        double t44 = t6 * t13 * t25 * 2.0;
        double t61 = t8 * t18 * t31 * 2.0;
        double t45 = t44 - t61;
        double t46 = t6 * t15 * t29 * 2.0;
        double t47 = t3 * t18 * t31 * 2.0;
        double t48 = t46 + t47;
        double t49 = d * t10 * t28;
        double t50 = t5 * t13 * t25 * 2.0;
        double t51 = t10 * t15 * t29 * 2.0;
        double t52 = t50 + t51;
        double t53 = t2 * t13 * t25 * 2.0;
        double t63 = t10 * t18 * t31 * 2.0;
        double t54 = t53 - t63;
        double t55 = t2 * t15 * t29 * 2.0;
        double t56 = t5 * t18 * t31 * 2.0;
        double t57 = t55 + t56;
        double t58 = d * t28 * t30;
        double t60 = d * t3 * t28;
        double t62 = d * t2 * t28;

        Jxb1(0, 0) = -s1 + (d * t17 * t26 * t35) / 2;
        Jxb1(0, 1) = -t32 - (d * t17 * t26 * t37) / 2;
        Jxb1(0, 2) = -(d * t17 * t26 * t40) / 2 + d * t27 * t28;
        Jxb1(1, 0) = -(d * t11 * t26 * t35) / 2 + t32;
        Jxb1(1, 1) = -s1 + (d * t11 * t26 * t37) / 2;
        Jxb1(1, 2) = -t58 + (d * t11 * t26 * t40) / 2;
        Jxb1(2, 0) = -d * t27 * t28 + (d * t7 * t26 * t35) / 2;
        Jxb1(2, 1) = -(d * t7 * t26 * t37) / 2 + t58;
        Jxb1(2, 2) = -s1 - (d * t7 * t26 * t40) / 2;

        Jxb2(0, 0) = -s2 - (d * t17 * t26 * t43) / 2;
        Jxb2(0, 1) = d * t8 * t28 + (d * t17 * t26 * t45) / 2;
        Jxb2(0, 2) = -t60 + (d * t17 * t26 * t48) / 2;
        Jxb2(1, 0) = -d * t8 * t28 + (d * t11 * t26 * t43) / 2, Jxb2(1, 1) = -s2 - (d * t11 * t26 * t45) / 2;
        Jxb2(1, 2) = -(d * t11 * t26 * t48) / 2 + d * t6 * t28;
        Jxb2(2, 0) = -(d * t7 * t26 * t43) / 2 + t60;
        Jxb2(2, 1) = -d * t6 * t28 + (d * t7 * t26 * t45) / 2;
        Jxb2(2, 2) = -s2 + (d * t7 * t26 * t48) / 2;

        Jxb3(0, 0) = -s3 + (d * t17 * t26 * t52) / 2;
        Jxb3(0, 1) = -t49 - (d * t17 * t26 * t54) / 2;
        Jxb3(0, 2) = -(d * t17 * t26 * t57) / 2 + d * t5 * t28;
        Jxb3(1, 0) = -(d * t11 * t26 * t52) / 2 + t49;
        Jxb3(1, 1) = -s3 + (d * t11 * t26 * t54) / 2;
        Jxb3(1, 2) = -t62 + (d * t11 * t26 * t57) / 2;
        Jxb3(2, 0) = -d * t5 * t28 + (d * t7 * t26 * t52) / 2;
        Jxb3(2, 1) = -(d * t7 * t26 * t54) / 2 + t62;
        Jxb3(2, 2) = -s3 - (d * t7 * t26 * t57) / 2;
    } else {
        // simplified jacobian when offset d = 0;
        Jxb1.setZero();
        Jxb2.setZero();
        Jxb3.setZero();
        Jxb1.fillDiagonal(-s1);
        Jxb2.fillDiagonal(-s2);
        Jxb3.fillDiagonal(-s3);
    }

    constraint1.Get_tuple_a().Get_Cq().segment(0, 3) = Jxa.row(0);
    constraint2.Get_tuple_a().Get_Cq().segment(0, 3) = Jxa.row(1);
    constraint3.Get_tuple_a().Get_Cq().segment(0, 3) = Jxa.row(2);

    constraint1.Get_tuple_b().Get_Cq_1().segment(0, 3) = Jxb1.row(0);
    constraint2.Get_tuple_b().Get_Cq_1().segment(0, 3) = Jxb1.row(1);
    constraint3.Get_tuple_b().Get_Cq_1().segment(0, 3) = Jxb1.row(2);

    constraint1.Get_tuple_b().Get_Cq_2().segment(0, 3) = Jxb2.row(0);
    constraint2.Get_tuple_b().Get_Cq_2().segment(0, 3) = Jxb2.row(1);
    constraint3.Get_tuple_b().Get_Cq_2().segment(0, 3) = Jxb2.row(2);

    constraint1.Get_tuple_b().Get_Cq_3().segment(0, 3) = Jxb3.row(0);
    constraint2.Get_tuple_b().Get_Cq_3().segment(0, 3) = Jxb3.row(1);
    constraint3.Get_tuple_b().Get_Cq_3().segment(0, 3) = Jxb3.row(2);
}